

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbmp.c
# Opt level: O1

void putmbi(int i,_func_void_int_void_ptr *putout,void *out)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  
  if (i == 0) {
    iVar1 = 0;
  }
  else {
    bVar2 = 0;
    iVar3 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + 1;
      iVar3 = iVar3 + (0x7f << (bVar2 & 0x1f) & i);
      bVar2 = bVar2 + 7;
    } while (iVar3 != i);
  }
  if (1 < iVar1) {
    iVar3 = iVar1 + 1;
    iVar1 = iVar1 * 7;
    do {
      iVar1 = iVar1 + -7;
      (*putout)((0x7f << ((byte)iVar1 & 0x1f) & i) >> ((byte)iVar1 & 0x1f) | 0x80,out);
      iVar3 = iVar3 + -1;
    } while (2 < iVar3);
  }
  (*putout)(i & 0x7f,out);
  return;
}

Assistant:

void putmbi(int i, void (*putout)(int c, void *out), void *out)
{
	int cnt, l, accu;

	/* Get number of septets */
	accu = cnt = 0;
	while(accu != i) {
		accu += i & 0x7f << 7 * cnt++;
	}

	/* Produce the multibyte output */
	for(l = cnt - 1; l > 0; l--) {
		putout(0x80 | (i & 0x7f << 7 * l) >> 7 * l, out);
	}

	putout(i & 0x7f, out);
}